

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# importer.cpp
# Opt level: O0

void __thiscall
Importer_warningUnrequiredCircularDependencyUnits_Test::
~Importer_warningUnrequiredCircularDependencyUnits_Test
          (Importer_warningUnrequiredCircularDependencyUnits_Test *this)

{
  Importer_warningUnrequiredCircularDependencyUnits_Test *this_local;
  
  ~Importer_warningUnrequiredCircularDependencyUnits_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Importer, warningUnrequiredCircularDependencyUnits)
{
    auto parser = libcellml::Parser::create();
    auto importer = libcellml::Importer::create();
    auto model = parser->parseModel(fileContents("importer/master2.cellml"));
    EXPECT_EQ(size_t(0), parser->issueCount());
    importer->resolveImports(model, resourcePath("importer/"));
    EXPECT_FALSE(model->hasUnresolvedImports());

    // Expect no issues as the circular dependency is not instantiated.
    EXPECT_EQ(size_t(0), importer->issueCount());
}